

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChValueSpecific<chrono::ChSharedMassBody>::CallArchiveOut
          (ChValueSpecific<chrono::ChSharedMassBody> *this,ChArchiveOut *marchive)

{
  _archive_out<chrono::ChSharedMassBody>(this,marchive);
  return;
}

Assistant:

virtual void CallArchiveOut(ChArchiveOut& marchive) { 
          this->_archive_out(marchive);
      }